

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O3

void Abc_ConvertHopToGia_rec1(Gia_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress3.c"
                  ,0x31,"void Abc_ConvertHopToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Abc_ConvertHopToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_ConvertHopToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    uVar3 = 0xffffffff;
    uVar4 = 0xffffffff;
    puVar2 = (uint *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (puVar2 != (uint *)0x0) {
      uVar4 = *puVar2;
      if ((int)uVar4 < 0) goto LAB_002b904f;
      uVar4 = uVar4 ^ (uint)pObj->pFanin0 & 1;
    }
    puVar2 = (uint *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (puVar2 != (uint *)0x0) {
      uVar3 = *puVar2;
      if ((int)uVar3 < 0) {
LAB_002b904f:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar3 = uVar3 ^ (uint)pObj->pFanin1 & 1;
    }
    iVar1 = Gia_ManHashAnd(p,uVar4,uVar3);
    (pObj->field_0).iData = iVar1;
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress3.c"
                    ,0x37,"void Abc_ConvertHopToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Converts AIG from HOP to GIA.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_ConvertHopToGia_rec1( Gia_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertHopToGia_rec1( p, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertHopToGia_rec1( p, Hop_ObjFanin1(pObj) );
    pObj->iData = Gia_ManHashAnd( p, Hop_ObjChild0CopyI(pObj), Hop_ObjChild1CopyI(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}